

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbasictimer.cpp
# Opt level: O3

void __thiscall QBasicTimer::stop(QBasicTimer *this)

{
  bool bVar1;
  QAbstractEventDispatcher *this_00;
  
  if (this->m_id != Invalid) {
    this_00 = (QAbstractEventDispatcher *)QAbstractEventDispatcher::instance((QThread *)0x0);
    if ((this_00 != (QAbstractEventDispatcher *)0x0) &&
       (bVar1 = QAbstractEventDispatcher::unregisterTimer(this_00,this->m_id), !bVar1)) {
      stop();
      return;
    }
    QAbstractEventDispatcherPrivate::releaseTimerId(this->m_id);
  }
  this->m_id = Invalid;
  return;
}

Assistant:

void QBasicTimer::stop()
{
    if (isActive()) {
        QAbstractEventDispatcher *eventDispatcher = QAbstractEventDispatcher::instance();
        if (eventDispatcher && !eventDispatcher->unregisterTimer(m_id)) {
            qWarning("QBasicTimer::stop: Failed. Possibly trying to stop from a different thread");
            return;
        }
        QAbstractEventDispatcherPrivate::releaseTimerId(m_id);
    }
    m_id = Qt::TimerId::Invalid;
}